

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::DecodeBase64
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,char *in)

{
  size_type max_out;
  size_t in_00;
  int iVar1;
  size_t sVar2;
  uchar *out_00;
  size_type local_28;
  size_t len;
  char *in_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  len = (size_t)in;
  in_local = (char *)out;
  sVar2 = strlen(in);
  iVar1 = EVP_DecodedLength(&local_28,sVar2);
  if (iVar1 == 0) {
    fprintf(_stderr,"EVP_DecodedLength failed\n");
    out_local._7_1_ = false;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_local,local_28);
    out_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_local);
    in_00 = len;
    max_out = local_28;
    sVar2 = strlen((char *)len);
    iVar1 = EVP_DecodeBase64(out_00,&local_28,max_out,(uint8_t *)in_00,sVar2);
    if (iVar1 == 0) {
      fprintf(_stderr,"EVP_DecodeBase64 failed\n");
      out_local._7_1_ = false;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_local,local_28);
      out_local._7_1_ = true;
    }
  }
  return out_local._7_1_;
}

Assistant:

static bool DecodeBase64(std::vector<uint8_t> *out, const char *in) {
  size_t len;
  if (!EVP_DecodedLength(&len, strlen(in))) {
    fprintf(stderr, "EVP_DecodedLength failed\n");
    return false;
  }

  out->resize(len);
  if (!EVP_DecodeBase64(out->data(), &len, len, (const uint8_t *)in,
                        strlen(in))) {
    fprintf(stderr, "EVP_DecodeBase64 failed\n");
    return false;
  }
  out->resize(len);
  return true;
}